

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall capnp::compiler::Compiler::Impl::clearWorkspace(Impl *this)

{
  Type local_28;
  undefined1 local_20 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_compiler_c__:1172:3)>
  _kjDefer1172;
  Impl *this_local;
  
  local_28.this = this;
  _kjDefer1172._8_8_ = this;
  kj::defer<capnp::compiler::Compiler::Impl::clearWorkspace()::__0>((kj *)local_20,&local_28);
  kj::dtor<capnp::compiler::Compiler::Impl::Workspace>(&this->workspace);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++:1172:3)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_compiler_c__:1172:3)>
               *)local_20);
  return;
}

Assistant:

void Compiler::Impl::clearWorkspace() {
  // Make sure we reconstruct the workspace even if destroying it throws an exception.
  KJ_DEFER(kj::ctor(workspace, *this));
  kj::dtor(workspace);
}